

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Request * __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,PromiseNetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  NetworkAddressHttpClient *this_00;
  PromiseArena *pPVar1;
  SourceLocation location;
  undefined8 uVar2;
  undefined8 uVar3;
  PromiseBase node;
  PromiseArenaMember *node_00;
  Event *pEVar4;
  void *pvVar5;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  Event *pEVar7;
  void *__arg;
  TransformPromiseNodeBase *this_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11),_void>
  combined;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  undefined1 local_198 [40];
  Event *pEStack_170;
  PromiseArena *pPStack_168;
  PromiseBase local_158;
  PromiseArenaMember *local_150;
  char local_148;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_140;
  Event *local_138;
  Event *pEStack_130;
  PromiseArena *pPStack_128;
  undefined1 auStack_120 [96];
  char *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  Maybe<unsigned_long> local_a8;
  HttpHeaders local_98;
  char *pcVar6;
  
  pvVar5 = (void *)url.content.size_;
  this_00 = (this->client).ptr.ptr;
  local_198._24_8_ = __return_storage_ptr__;
  if (this_00 == (NetworkAddressHttpClient *)0x0) {
    pcVar6 = url.content.ptr;
    __arg = pvVar5;
    heapString((String *)(local_198 + 0x20),(long)pvVar5 - 1);
    __flags = (int)pcVar6;
    __child_stack = extraout_RDX;
    if ((long)pvVar5 - 1U != 0) {
      pEVar7 = pEStack_170;
      if (pEStack_170 != (Event *)0x0) {
        pEVar7 = (Event *)local_198._32_8_;
      }
      memcpy(pEVar7,url.content.ptr,(long)pvVar5 - 1U);
      __child_stack = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_98,(__fn *)headers,__child_stack,__flags,__arg);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_198);
    uVar2 = local_198._0_8_;
    local_150 = (PromiseArenaMember *)CONCAT44(local_150._4_4_,method);
    local_148 = (expectedBodySize->ptr).isSet;
    if ((bool)local_148 == true) {
      local_140 = (expectedBodySize->ptr).field_1;
    }
    local_138 = (Event *)local_198._32_8_;
    pEStack_130 = pEStack_170;
    pPStack_128 = pPStack_168;
    local_198._32_8_ = (Event *)0x0;
    pEStack_170 = (Event *)0x0;
    auStack_120._0_8_ = local_98.table;
    auStack_120._8_8_ = local_98.indexedHeaders.ptr;
    auStack_120._16_8_ = local_98.indexedHeaders.size_;
    local_98.indexedHeaders.ptr = (StringPtr *)0x0;
    local_98.indexedHeaders.size_ = 0;
    auStack_120._24_8_ = local_98.indexedHeaders.disposer;
    auStack_120._32_8_ = local_98.unindexedHeaders.builder.ptr;
    auStack_120._40_8_ = local_98.unindexedHeaders.builder.pos;
    auStack_120._48_8_ = local_98.unindexedHeaders.builder.endPtr;
    local_98.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_98.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_98.unindexedHeaders.builder.endPtr = (Header *)0x0;
    auStack_120._56_8_ = local_98.unindexedHeaders.builder.disposer;
    auStack_120._64_8_ = local_98.ownedStrings.builder.ptr;
    auStack_120._72_8_ = local_98.ownedStrings.builder.pos;
    auStack_120._80_8_ = local_98.ownedStrings.builder.endPtr;
    auStack_120._88_8_ = local_98.ownedStrings.builder.disposer;
    local_98.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_98.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_98.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    pPVar1 = ((PromiseArenaMember *)local_198._0_8_)->arena;
    local_158.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_198._0_8_ - (long)pPVar1) < 0xb8) {
      pvVar5 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x348);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)local_198,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6219:11)>
                 ::anon_class_152_5_b9fef01d_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x348) = &PTR_destroy_006d8b68;
      ((OwnPromiseNode *)((long)pvVar5 + 0x368))->ptr = (PromiseNode *)local_158.node.ptr;
      *(uint *)((long)pvVar5 + 0x370) = (uint)local_150;
      *(char *)((long)pvVar5 + 0x378) = local_148;
      if (local_148 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)((long)pvVar5 + 0x380) =
             local_140;
        local_148 = '\0';
      }
      *(Event **)((long)pvVar5 + 0x388) = local_138;
      *(Event **)((long)pvVar5 + 0x390) = pEStack_130;
      *(PromiseArena **)((long)pvVar5 + 0x398) = pPStack_128;
      *(undefined8 *)((long)pvVar5 + 0x3a0) = auStack_120._0_8_;
      *(undefined8 *)((long)pvVar5 + 0x3a8) = auStack_120._8_8_;
      *(undefined8 *)((long)pvVar5 + 0x3b0) = auStack_120._16_8_;
      *(undefined8 *)((long)pvVar5 + 0x3b8) = auStack_120._24_8_;
      *(undefined8 *)((long)pvVar5 + 0x3c0) = auStack_120._32_8_;
      *(undefined8 *)((long)pvVar5 + 0x3c8) = auStack_120._40_8_;
      *(undefined8 *)((long)pvVar5 + 0x3d0) = auStack_120._48_8_;
      *(undefined8 *)((long)pvVar5 + 0x3d8) = auStack_120._56_8_;
      *(undefined8 *)((long)pvVar5 + 0x3e0) = auStack_120._64_8_;
      *(undefined8 *)((long)pvVar5 + 1000) = auStack_120._72_8_;
      *(undefined8 *)((long)pvVar5 + 0x3f0) = auStack_120._80_8_;
      *(undefined8 *)((long)pvVar5 + 0x3f8) = auStack_120._88_8_;
      *(void **)((long)pvVar5 + 0x350) = pvVar5;
    }
    else {
      ((PromiseArenaMember *)local_198._0_8_)->arena = (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)(local_198._0_8_ + -0xc0))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)local_198,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6219:11)>
                 ::anon_class_152_5_b9fef01d_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0xc0))->arena = (PromiseArena *)&PTR_destroy_006d8b68;
      ((PromiseArenaMember *)(uVar2 + -0xa0))->arena = (PromiseArena *)local_158.node.ptr;
      *(uint *)&((PromiseArenaMember *)(uVar2 + -0x90))->_vptr_PromiseArenaMember = (uint)local_150;
      *(char *)&((PromiseArenaMember *)(uVar2 + -0x90))->arena = local_148;
      if (local_148 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(uVar2 + -0x80) = local_140;
        local_148 = '\0';
      }
      ((PromiseArenaMember *)(uVar2 + -0x80))->arena = (PromiseArena *)local_138;
      ((PromiseArenaMember *)(uVar2 + -0x70))->_vptr_PromiseArenaMember = (_func_int **)pEStack_130;
      ((PromiseArenaMember *)(uVar2 + -0x70))->arena = pPStack_128;
      ((PromiseArenaMember *)(uVar2 + -0x60))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._0_8_;
      ((PromiseArenaMember *)(uVar2 + -0x60))->arena = (PromiseArena *)auStack_120._8_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._16_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->arena = (PromiseArena *)auStack_120._24_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._32_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->arena = (PromiseArena *)auStack_120._40_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._48_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)auStack_120._56_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._64_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->arena = (PromiseArena *)auStack_120._72_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember =
           (_func_int **)auStack_120._80_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = (PromiseArena *)auStack_120._88_8_;
      ((PromiseArenaMember *)(uVar2 + -0xb0))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    auStack_120._80_8_ = (Context *)0x0;
    auStack_120._72_8_ = (Disposer *)0x0;
    auStack_120._64_8_ = (ArrayDisposer *)0x0;
    auStack_120._48_8_ = (char *)0x0;
    auStack_120._40_8_ = 0;
    auStack_120._32_8_ = (char *)0x0;
    auStack_120._16_8_ = 0;
    auStack_120._8_8_ = (char *)0x0;
    pEStack_130 = (Event *)0x0;
    local_138 = (Event *)0x0;
    local_198._8_8_ = this_01;
    HttpHeaders::~HttpHeaders((HttpHeaders *)auStack_120);
    pEVar4 = pEStack_130;
    pEVar7 = local_138;
    if (local_138 != (Event *)0x0) {
      local_138 = (Event *)0x0;
      pEStack_130 = (Event *)0x0;
      (*(code *)**(undefined8 **)pPStack_128->bytes)(pPStack_128,pEVar7,1,pEVar4,pEVar4,0);
    }
    uVar2 = local_198._0_8_;
    if ((PromiseArenaMember *)local_198._0_8_ != (PromiseArenaMember *)0x0) {
      local_198._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    uStack_b8 = "request";
    local_b0 = (void *)0x1400001851;
    location.function = "request";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1851;
    location.columnNumber = 0x14;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)&local_158,location);
    uVar3 = local_198._24_8_;
    local_198._16_8_ = local_158.node.ptr;
    local_158.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    newPromisedStream((kj *)local_198._24_8_,
                      (Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)(local_198 + 0x10)
                     );
    uVar2 = local_198._16_8_;
    (((Promise<kj::HttpClient::Response> *)(uVar3 + 0x10))->super_PromiseBase).node.ptr =
         (PromiseNode *)local_150;
    local_150 = (PromiseArenaMember *)0x0;
    if ((PromiseNetworkAddressHttpClient *)local_198._16_8_ !=
        (PromiseNetworkAddressHttpClient *)0x0) {
      local_198._16_8_ = (PromiseNetworkAddressHttpClient *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
      node_00 = local_150;
      if (local_150 != (PromiseArenaMember *)0x0) {
        local_150 = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose(node_00);
      }
    }
    node.node.ptr = local_158.node.ptr;
    if (local_158.node.ptr != (PromiseNode *)0x0) {
      local_158.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    uVar2 = local_198._8_8_;
    if ((TransformPromiseNodeBase *)local_198._8_8_ != (TransformPromiseNodeBase *)0x0) {
      local_198._8_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    HttpHeaders::~HttpHeaders(&local_98);
    pEVar7 = pEStack_170;
    uVar2 = local_198._32_8_;
    __return_storage_ptr__ = (Request *)local_198._24_8_;
    if ((Event *)local_198._32_8_ != (Event *)0x0) {
      local_198._32_8_ = (Event *)0x0;
      pEStack_170 = (Event *)0x0;
      (*(code *)**(undefined8 **)pPStack_168->bytes)(pPStack_168,uVar2,1,pEVar7,pEVar7,0);
    }
  }
  else {
    local_a8.ptr.isSet = (expectedBodySize->ptr).isSet;
    if (local_a8.ptr.isSet == true) {
      local_a8.ptr.field_1 = (expectedBodySize->ptr).field_1;
    }
    NetworkAddressHttpClient::request(__return_storage_ptr__,this_00,method,url,headers,&local_a8);
  }
  return (Request *)(EventLoop *)__return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(c, client) {
      return c->request(method, url, headers, expectedBodySize);
    }